

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderStructTests.cpp
# Opt level: O0

MovePtr<vkt::sr::(anonymous_namespace)::ShaderStructCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderStructCase>_>
* vkt::sr::anon_unknown_0::createStructCase
            (MovePtr<vkt::sr::(anonymous_namespace)::ShaderStructCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderStructCase>_>
             *__return_storage_ptr__,TestContext *testCtx,string *name,string *description,
            bool isVertexCase,ShaderEvalFunc evalFunc,UniformSetupFunc uniformFunc,
            LineStream *shaderSrc)

{
  int iVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  ShaderStructCase *this;
  DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderStructCase> local_2ca;
  allocator<char> local_2c9;
  string local_2c8;
  StringTemplate local_2a8;
  string local_288;
  allocator<char> local_261;
  key_type local_260;
  allocator<char> local_239;
  key_type local_238;
  allocator<char> local_211;
  key_type local_210;
  allocator<char> local_1e9;
  key_type local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  StringTemplate local_1a0;
  string local_180;
  allocator<char> local_159;
  key_type local_158;
  allocator<char> local_131;
  key_type local_130;
  allocator<char> local_109;
  key_type local_108;
  allocator<char> local_e1;
  key_type local_e0;
  undefined1 local_c0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  spParams;
  string fragSrc;
  string vertSrc;
  allocator<char> local_39;
  ShaderEvalFunc local_38;
  ShaderEvalFunc evalFunc_local;
  string *psStack_28;
  bool isVertexCase_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  
  local_38 = evalFunc;
  evalFunc_local._7_1_ = isVertexCase;
  psStack_28 = description;
  description_local = name;
  name_local = (string *)testCtx;
  testCtx_local = (TestContext *)__return_storage_ptr__;
  if (sr::(anonymous_namespace)::
      createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
      ::defaultVertSrc_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&sr::(anonymous_namespace)::
                                 createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                                 ::defaultVertSrc_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &sr::(anonymous_namespace)::
                  createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                  ::defaultVertSrc_abi_cxx11_,
                 "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_coords;\n\nvoid main (void)\n{\n\tv_coords = a_coords;\n\tgl_Position = a_position;\n}\n"
                 ,&local_39);
      std::allocator<char>::~allocator(&local_39);
      __cxa_atexit(std::__cxx11::string::~string,
                   &sr::(anonymous_namespace)::
                    createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                    ::defaultVertSrc_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&sr::(anonymous_namespace)::
                           createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                           ::defaultVertSrc_abi_cxx11_);
    }
  }
  if (sr::(anonymous_namespace)::
      createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
      ::defaultFragSrc_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&sr::(anonymous_namespace)::
                                 createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                                 ::defaultFragSrc_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &sr::(anonymous_namespace)::
                  createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                  ::defaultFragSrc_abi_cxx11_,
                 "#version 310 es\nlayout(location = 0) in mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n\to_color = v_color;\n}\n"
                 ,(allocator<char> *)(vertSrc.field_2._M_local_buf + 0xb));
      std::allocator<char>::~allocator((allocator<char> *)(vertSrc.field_2._M_local_buf + 0xb));
      __cxa_atexit(std::__cxx11::string::~string,
                   &sr::(anonymous_namespace)::
                    createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                    ::defaultFragSrc_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&sr::(anonymous_namespace)::
                           createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                           ::defaultFragSrc_abi_cxx11_);
    }
  }
  std::__cxx11::string::string((string *)(fragSrc.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&spParams._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_c0);
  if ((evalFunc_local._7_1_ & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"HEADER",&local_1e9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_c0,&local_1e8);
    std::__cxx11::string::operator=
              ((string *)pmVar2,
               "#version 310 es\nlayout(location = 0) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;"
              );
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"COORDS",&local_211);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_c0,&local_210);
    std::__cxx11::string::operator=((string *)pmVar2,"v_coords");
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"DST",&local_239);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_c0,&local_238);
    std::__cxx11::string::operator=((string *)pmVar2,"o_color");
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"ASSIGN_POS",&local_261)
    ;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_c0,&local_260);
    std::__cxx11::string::operator=((string *)pmVar2,"");
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    std::__cxx11::string::operator=
              ((string *)(fragSrc.field_2._M_local_buf + 8),
               (string *)
               &sr::(anonymous_namespace)::
                createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                ::defaultVertSrc_abi_cxx11_);
    pcVar3 = LineStream::str(shaderSrc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,pcVar3,&local_2c9);
    tcu::StringTemplate::StringTemplate(&local_2a8,&local_2c8);
    tcu::StringTemplate::specialize
              (&local_288,&local_2a8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_c0);
    std::__cxx11::string::operator=
              ((string *)&spParams._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    tcu::StringTemplate::~StringTemplate(&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"HEADER",&local_e1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_c0,&local_e0);
    std::__cxx11::string::operator=
              ((string *)pmVar2,
               "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_color;"
              );
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"COORDS",&local_109);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_c0,&local_108);
    std::__cxx11::string::operator=((string *)pmVar2,"a_coords");
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"DST",&local_131);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_c0,&local_130);
    std::__cxx11::string::operator=((string *)pmVar2,"v_color");
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"ASSIGN_POS",&local_159)
    ;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_c0,&local_158);
    std::__cxx11::string::operator=((string *)pmVar2,"gl_Position = a_position;");
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    pcVar3 = LineStream::str(shaderSrc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,pcVar3,&local_1c1);
    tcu::StringTemplate::StringTemplate(&local_1a0,&local_1c0);
    tcu::StringTemplate::specialize
              (&local_180,&local_1a0,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_c0);
    std::__cxx11::string::operator=
              ((string *)(fragSrc.field_2._M_local_buf + 8),(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    tcu::StringTemplate::~StringTemplate(&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    std::__cxx11::string::operator=
              ((string *)&spParams._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (string *)
               &sr::(anonymous_namespace)::
                createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                ::defaultFragSrc_abi_cxx11_);
  }
  this = (ShaderStructCase *)operator_new(0xe0);
  ShaderStructCase::ShaderStructCase
            (this,(TestContext *)name_local,description_local,psStack_28,
             (bool)(evalFunc_local._7_1_ & 1),local_38,uniformFunc,
             (string *)((long)&fragSrc.field_2 + 8),
             (string *)&spParams._M_t._M_impl.super__Rb_tree_header._M_node_count);
  de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderStructCase>::DefaultDeleter(&local_2ca);
  de::details::
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderStructCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderStructCase>_>
  ::MovePtr(__return_storage_ptr__,this);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_c0);
  std::__cxx11::string::~string
            ((string *)&spParams._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)(fragSrc.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

static de::MovePtr<ShaderStructCase> createStructCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, bool isVertexCase, ShaderEvalFunc evalFunc, UniformSetupFunc uniformFunc, const LineStream& shaderSrc)
{
	static std::string defaultVertSrc =
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_coords;\n\n"
		"void main (void)\n"
		"{\n"
		"	v_coords = a_coords;\n"
		"	gl_Position = a_position;\n"
		"}\n";
	static std::string defaultFragSrc =
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_color;\n"
		"layout(location = 0) out mediump vec4 o_color;\n\n"
		"void main (void)\n"
		"{\n"
		"	o_color = v_color;\n"
		"}\n";

	// Fill in specialization parameters and build the shader source.
	std::string vertSrc;
	std::string fragSrc;
	std::map<std::string, std::string> spParams;

	if (isVertexCase)
	{
		spParams["HEADER"] =
			"#version 310 es\n"
			"layout(location = 0) in highp vec4 a_position;\n"
			"layout(location = 1) in highp vec4 a_coords;\n"
			"layout(location = 0) out mediump vec4 v_color;";
		spParams["COORDS"]		= "a_coords";
		spParams["DST"]			= "v_color";
		spParams["ASSIGN_POS"]	= "gl_Position = a_position;";

		vertSrc = tcu::StringTemplate(shaderSrc.str()).specialize(spParams);
		fragSrc = defaultFragSrc;
	}
	else
	{
		spParams["HEADER"]	=
			"#version 310 es\n"
			"layout(location = 0) in mediump vec4 v_coords;\n"
			"layout(location = 0) out mediump vec4 o_color;";
		spParams["COORDS"]			= "v_coords";
		spParams["DST"]				= "o_color";
		spParams["ASSIGN_POS"]		= "";

		vertSrc = defaultVertSrc;
		fragSrc = tcu::StringTemplate(shaderSrc.str()).specialize(spParams);
	}

	return de::MovePtr<ShaderStructCase>(new ShaderStructCase(testCtx, name, description, isVertexCase, evalFunc, uniformFunc, vertSrc, fragSrc));
}